

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3LockAndPrepare
              (sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pOld,sqlite3_stmt **ppStmt,
              char **pzTail)

{
  u8 uVar1;
  Btree *pBVar2;
  bool bVar3;
  sqlite3 *db_00;
  TriggerPrg *p;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  Vdbe *pVVar8;
  long lVar9;
  bool bVar10;
  char *zErrMsg;
  u32 local_1f4;
  ulong local_1f0;
  char *local_1e8;
  sqlite3_stmt **local_1e0;
  Vdbe *local_1d8;
  Parse local_1d0;
  
  *ppStmt = (sqlite3_stmt *)0x0;
  local_1e0 = ppStmt;
  local_1d8 = pOld;
  iVar5 = sqlite3SafetyCheckOk(db);
  if ((zSql == (char *)0x0) || (iVar5 == 0)) {
    iVar5 = sqlite3MisuseError(0x1e5eb);
    return iVar5;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  sqlite3BtreeEnterAll(db);
  bVar4 = (byte)prepFlags;
  local_1f0 = (ulong)(uint)nBytes;
  local_1e8 = zSql + local_1f0;
  bVar10 = true;
  do {
    do {
      bVar3 = bVar10;
      zErrMsg = (char *)0x0;
      memset(&local_1d0,0,0xcc);
      memset(&local_1d0.sLastToken,0,0xa0);
      local_1d0.pReprepare = local_1d8;
      if ((prepFlags & 1) != 0) {
        local_1d0.disableLookaside = '\x01';
        (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
      }
      lVar9 = 0;
      local_1d0.disableVtab = bVar4 >> 2 & 1;
      for (lVar7 = 0; lVar7 < db->nDb; lVar7 = lVar7 + 1) {
        pBVar2 = *(Btree **)((long)&db->aDb->pBt + lVar9);
        if (pBVar2 != (Btree *)0x0) {
          sqlite3BtreeEnter(pBVar2);
          iVar5 = querySharedCacheTableLock(pBVar2,1,'\x01');
          sqlite3BtreeLeave(pBVar2);
          if (iVar5 != 0) {
            sqlite3ErrorWithMsg(db,iVar5,"database schema is locked: %s",
                                *(undefined8 *)((long)&db->aDb->zDbSName + lVar9));
            goto LAB_001240c9;
          }
        }
        lVar9 = lVar9 + 0x20;
      }
      sqlite3VtabUnlockList(db);
      local_1d0.db = db;
      if ((nBytes < 0) || ((nBytes != 0 && (zSql[local_1f0 - 1] == '\0')))) {
        sqlite3RunParser(&local_1d0,zSql,&zErrMsg);
LAB_00123e8b:
        db_00 = local_1d0.db;
        if (local_1d0.rc == 0x65) {
          local_1d0.rc = 0;
        }
        if (local_1d0.checkSchema != '\0') {
          lVar9 = 0;
          for (lVar7 = 0; lVar7 < db_00->nDb; lVar7 = lVar7 + 1) {
            pBVar2 = *(Btree **)((long)&db_00->aDb->pBt + lVar9);
            if (pBVar2 != (Btree *)0x0) {
              uVar1 = pBVar2->inTrans;
              if ((uVar1 == '\0') &&
                 (iVar5 = sqlite3BtreeBeginTrans(pBVar2,0,(int *)0x0), iVar5 != 0)) {
                if ((iVar5 == 0xc0a) || (iVar5 == 7)) {
                  sqlite3OomFault(db_00);
                }
                break;
              }
              sqlite3BtreeGetMeta(pBVar2,1,&local_1f4);
              if (local_1f4 != **(u32 **)((long)&db_00->aDb->pSchema + lVar9)) {
                sqlite3ResetOneSchema(db_00,(int)lVar7);
                local_1d0.rc = 0x11;
              }
              if (uVar1 == '\0') {
                sqlite3BtreeCommit(pBVar2);
              }
            }
            lVar9 = lVar9 + 0x20;
          }
        }
        if (db->mallocFailed != '\0') {
          local_1d0.rc = 7;
        }
        iVar5 = local_1d0.rc;
        if (pzTail != (char **)0x0) {
          *pzTail = local_1d0.zTail;
        }
        if ((local_1d0.explain != '\0' && local_1d0.pVdbe != (Vdbe *)0x0) && local_1d0.rc == 0) {
          bVar10 = local_1d0.explain == '\x02';
          sqlite3VdbeSetNumCols(local_1d0.pVdbe,(uint)!bVar10 * 4 + 4);
          for (lVar7 = 0; ((ulong)bVar10 * 4 + 8) - (ulong)((uint)bVar10 * 8) != lVar7;
              lVar7 = lVar7 + 1) {
            sqlite3VdbeSetColName
                      (local_1d0.pVdbe,(int)lVar7,0,
                       sqlite3Prepare_azColName_rel +
                       *(int *)(sqlite3Prepare_azColName_rel + (ulong)bVar10 * 0x20 + lVar7 * 4),
                       (_func_void_void_ptr *)0x0);
          }
        }
        pVVar8 = local_1d0.pVdbe;
        if ((db->init).busy == '\0') {
          if (local_1d0.pVdbe != (Vdbe *)0x0) {
            (local_1d0.pVdbe)->prepFlags = bVar4;
            if (-1 < (char)bVar4) {
              (local_1d0.pVdbe)->expmask = 0;
            }
            pcVar6 = sqlite3DbStrNDup((local_1d0.pVdbe)->db,zSql,
                                      (long)((int)local_1d0.zTail - (int)zSql));
            pVVar8->zSql = pcVar6;
            goto LAB_0012404f;
          }
LAB_00124069:
          pVVar8 = (Vdbe *)0x0;
LAB_0012406b:
          *local_1e0 = (sqlite3_stmt *)pVVar8;
        }
        else {
LAB_0012404f:
          if (local_1d0.pVdbe == (Vdbe *)0x0) goto LAB_00124069;
          if ((iVar5 == 0) && (pVVar8 = local_1d0.pVdbe, db->mallocFailed == '\0'))
          goto LAB_0012406b;
          sqlite3VdbeFinalize(local_1d0.pVdbe);
        }
        pcVar6 = zErrMsg;
        if (zErrMsg == (char *)0x0) {
          sqlite3Error(db,iVar5);
        }
        else {
          sqlite3ErrorWithMsg(db,iVar5,"%s",zErrMsg);
          sqlite3DbFreeNN(db,pcVar6);
        }
        while (p = local_1d0.pTriggerPrg, local_1d0.pTriggerPrg != (TriggerPrg *)0x0) {
          local_1d0.pTriggerPrg = (local_1d0.pTriggerPrg)->pNext;
          sqlite3DbFreeNN(db,p);
        }
      }
      else {
        if (nBytes <= db->aLimit[1]) {
          pcVar6 = sqlite3DbStrNDup(db,zSql,local_1f0);
          if (pcVar6 == (char *)0x0) {
            local_1d0.zTail = local_1e8;
          }
          else {
            sqlite3RunParser(&local_1d0,pcVar6,&zErrMsg);
            local_1d0.zTail = zSql + ((long)local_1d0.zTail - (long)pcVar6);
            sqlite3DbFreeNN(db,pcVar6);
          }
          goto LAB_00123e8b;
        }
        sqlite3ErrorWithMsg(db,0x12,"statement too long");
        iVar5 = sqlite3ApiExit(db,0x12);
      }
LAB_001240c9:
      sqlite3ParserReset(&local_1d0);
      bVar10 = bVar3;
    } while (iVar5 == 0x201);
    if (iVar5 != 0x11) break;
    sqlite3ResetOneSchema(db,-1);
    bVar10 = false;
  } while (bVar3);
  sqlite3BtreeLeaveAll(db);
  iVar5 = sqlite3ApiExit(db,iVar5);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar5;
}

Assistant:

static int sqlite3LockAndPrepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pOld,               /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;
  int cnt = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  do{
    /* Make multiple attempts to compile the SQL, until it either succeeds
    ** or encounters a permanent error.  A schema problem after one schema
    ** reset is considered a permanent error. */
    rc = sqlite3Prepare(db, zSql, nBytes, prepFlags, pOld, ppStmt, pzTail);
    assert( rc==SQLITE_OK || *ppStmt==0 );
  }while( rc==SQLITE_ERROR_RETRY
       || (rc==SQLITE_SCHEMA && (sqlite3ResetOneSchema(db,-1), cnt++)==0) );
  sqlite3BtreeLeaveAll(db);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}